

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool IsValidRealNumber(wchar_t *wsz,int length)

{
  wchar_t __wc;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int local_2c;
  wchar_t w;
  int i;
  bool bAtEnd;
  int iStack_20;
  bool bAtStart;
  int eCount;
  int puncCount;
  int length_local;
  wchar_t *wsz_local;
  
  if (length == 0) {
    wsz_local._7_1_ = false;
  }
  else {
    iStack_20 = 0;
    i = 0;
    bVar1 = true;
    bVar2 = false;
    for (local_2c = 0; local_2c < length; local_2c = local_2c + 1) {
      __wc = wsz[local_2c];
      iVar3 = iswspace(__wc);
      if (iVar3 == 0) {
        if ((__wc == L'.') || (__wc == L',')) {
          iStack_20 = iStack_20 + 1;
        }
        else if ((__wc == L'e') || (__wc == L'E')) {
          i = i + 1;
        }
        else {
          iVar3 = iswdigit(__wc);
          if (((iVar3 == 0) && (__wc != L'-')) && (__wc != L'+')) {
            return false;
          }
        }
        if (bVar2) {
          return false;
        }
        bVar1 = false;
      }
      else if (!bVar1) {
        bVar2 = true;
      }
    }
    if ((iStack_20 < 2) && (i < 2)) {
      wsz_local._7_1_ = true;
    }
    else {
      wsz_local._7_1_ = false;
    }
  }
  return wsz_local._7_1_;
}

Assistant:

static bool IsValidRealNumber(const wchar_t* wsz, int length)
{
  if (length == 0)
    return false;

  int puncCount = 0;
  int eCount = 0;

  bool bAtStart = true;
  bool bAtEnd = false;

  for (int i = 0; i < length; i++)
  {
    const auto w = wsz[i];

    // Skip past whitespace at the start of the string.
    if (iswspace(w))
    {
      if (bAtStart)
      {
        // Skip past white space at the beginning of string.
        continue;
      }
      else
      {
        // Otherwise, whitespace can only appear at the end of the string.
        bAtEnd = true;
        continue;
      }
    }

    if (w == L'.' || w == L',') puncCount++;
    else
    if (w == L'e' || w == L'E') eCount++;
    else
    if (!iswdigit(w) && (w != L'-') && (w != L'+'))
      return false;

    // Nothing can come after spaces at the end.
    if (bAtEnd)
      return false;

    bAtStart = false;
  }

  if ((puncCount > 1) || (eCount > 1))
    return false;

  return true;
}